

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::~ConsoleReporter(ConsoleReporter *this)

{
  (this->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__ConsoleReporter_0016d258;
  std::
  vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  ::~vector(&(this->super_StreamingReporterBase).m_rootSections);
  Ptr<Catch::ThreadedSectionInfo>::~Ptr(&(this->super_StreamingReporterBase).currentSectionInfo);
  Option<Catch::TestCaseInfo>::reset(&(this->super_StreamingReporterBase).unusedTestCaseInfo);
  Option<Catch::GroupInfo>::reset(&(this->super_StreamingReporterBase).unusedGroupInfo);
  Option<Catch::TestRunInfo>::reset(&(this->super_StreamingReporterBase).testRunInfo);
  Ptr<Catch::IConfig>::~Ptr(&(this->super_StreamingReporterBase).m_config);
  IReporter::~IReporter((IReporter *)this);
  return;
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}